

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::logStackBacktrace(SimpleLoggerMgr *this,size_t timeout_ms)

{
  ofstream *poVar1;
  pointer pcVar2;
  pointer pRVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  time_point now;
  long *plVar7;
  size_t sVar8;
  size_type *psVar9;
  ulong uVar10;
  RawStackInfo *entry;
  pointer pRVar11;
  string path;
  TimeInfo lt;
  char time_fmt [64];
  char filename [128];
  
  LOCK();
  (this->abortTimer).super___atomic_base<unsigned_long>._M_i = timeout_ms;
  UNLOCK();
  if ((this->crashDumpPath)._M_string_length != 0) {
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      TimeInfo::TimeInfo(&lt,now);
      uVar6 = getTzGap();
      uVar4 = -uVar6;
      if (0 < (int)uVar6) {
        uVar4 = uVar6;
      }
      uVar10 = (ulong)(((int)uVar6 >> 0x1f) * -2 + 0x2b);
      snprintf(filename,0x80,"dump_%04d%02d%02d_%02d%02d%02d%c%02d%02d.txt",(ulong)(uint)lt.year,
               (ulong)(uint)lt.month,(ulong)(uint)lt.day,(ulong)(uint)lt.hour,(ulong)(uint)lt.min,
               (ulong)(uint)lt.sec,uVar10,(ulong)uVar4 / 0x3c,(ulong)(uVar4 % 0x3c));
      pcVar2 = (this->crashDumpPath)._M_dataplus._M_p;
      time_fmt._0_8_ = time_fmt + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)time_fmt,pcVar2,pcVar2 + (this->crashDumpPath)._M_string_length);
      std::__cxx11::string::append(time_fmt);
      plVar7 = (long *)std::__cxx11::string::append(time_fmt);
      path._M_dataplus._M_p = (pointer)&path.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        path.field_2._M_allocated_capacity = *psVar9;
        path.field_2._8_8_ = plVar7[3];
      }
      else {
        path.field_2._M_allocated_capacity = *psVar9;
        path._M_dataplus._M_p = (pointer)*plVar7;
      }
      poVar1 = &this->crashDumpFile;
      path._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((char *)time_fmt._0_8_ != time_fmt + 0x10) {
        operator_delete((void *)time_fmt._0_8_);
      }
      std::ofstream::open((string *)poVar1,(_Ios_Openmode)&path);
      snprintf(time_fmt,0x40,"%04d-%02d-%02dT%02d:%02d:%02d.%03d%03d%c%02d:%02d",
               (ulong)(uint)lt.year,(ulong)(uint)lt.month,(ulong)(uint)lt.day,(ulong)(uint)lt.hour,
               (ulong)(uint)lt.min,(ulong)(uint)lt.sec,(ulong)(uint)lt.msec,(ulong)(uint)lt.usec,
               uVar10,(ulong)uVar4 / 0x3c,(ulong)(uVar4 % 0x3c));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"When: ",6);
      sVar8 = strlen(time_fmt);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,time_fmt,sVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      plVar7 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path._M_dataplus._M_p != &path.field_2) {
        operator_delete(path._M_dataplus._M_p);
      }
    }
  }
  flushCriticalInfo(this);
  addRawStackInfo(this,true);
  logStackBackTraceOtherThreads(this);
  pRVar3 = (this->crashDumpThreadStacks).
           super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar11 = (this->crashDumpThreadStacks).
                 super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar3; pRVar11 = pRVar11 + 1
      ) {
    flushRawStack(this,pRVar11);
  }
  pRVar3 = (this->crashDumpThreadStacks).
           super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar11 = (this->crashDumpThreadStacks).
                 super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar3; pRVar11 = pRVar11 + 1
      ) {
    flushStackTraceBuffer(this,pRVar11);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::logStackBacktrace(size_t timeout_ms) {
    // Set abort timeout: 60 seconds.
    abortTimer = timeout_ms;

    if (!crashDumpPath.empty() && !crashDumpFile.is_open()) {
        // Open crash dump file.
        TimeInfo lt( std::chrono::system_clock::now() );
        int tz_gap = getTzGap();
        int tz_gap_abs = (tz_gap < 0) ? (tz_gap * -1) : (tz_gap);

        char filename[128];
        snprintf(filename, 128, "dump_%04d%02d%02d_%02d%02d%02d%c%02d%02d.txt",
                lt.year, lt.month, lt.day,
                lt.hour, lt.min, lt.sec,
                (tz_gap >= 0) ? '+' : '-',
                (int)(tz_gap_abs / 60), tz_gap_abs % 60);
        std::string path = crashDumpPath + "/" + filename;
        crashDumpFile.open(path);

        char time_fmt[64];
        snprintf(time_fmt, 64, "%04d-%02d-%02dT%02d:%02d:%02d.%03d%03d%c%02d:%02d",
                lt.year, lt.month, lt.day,
                lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
                (tz_gap >= 0) ? '+' : '-',
                (int)(tz_gap_abs / 60), tz_gap_abs % 60);
        crashDumpFile << "When: " << time_fmt << std::endl << std::endl;
    }

    flushCriticalInfo();
    addRawStackInfo(true);
    // Collect other threads' stack info.
    logStackBackTraceOtherThreads();

    // Now print out.
    // For the case where `addr2line` is hanging, flush raw pointer first.
    for (RawStackInfo& entry: crashDumpThreadStacks) {
        flushRawStack(entry);
    }
    for (RawStackInfo& entry: crashDumpThreadStacks) {
        flushStackTraceBuffer(entry);
    }
}